

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O0

double p_ini_file_parameter_double(PIniFile *file,pchar *section,pchar *key,double default_val)

{
  pchar *str;
  pdouble ret;
  pchar *val;
  double default_val_local;
  pchar *key_local;
  pchar *section_local;
  PIniFile *file_local;
  
  str = pp_ini_file_find_parameter(file,section,key);
  file_local = (PIniFile *)default_val;
  if (str != (pchar *)0x0) {
    file_local = (PIniFile *)p_strtod(str);
    p_free(str);
  }
  return (double)file_local;
}

Assistant:

P_LIB_API double
p_ini_file_parameter_double (const PIniFile	*file,
			     const pchar	*section,
			     const pchar	*key,
			     double		default_val)
{
	pchar	*val;
	pdouble	ret;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return default_val;

	ret = p_strtod (val);
	p_free (val);

	return ret;
}